

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeSignedValueWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,BVec4 *colorMask,PixelBufferAccess *colorBuffer)

{
  int iVar1;
  int z;
  IVec4 local_60;
  undefined1 local_50 [8];
  IVec4 originalValue;
  Fragment *frag;
  int fragSampleNdx;
  int regSampleNdx;
  PixelBufferAccess *colorBuffer_local;
  BVec4 *colorMask_local;
  Fragment *inputFragments_local;
  int numSamplesPerFragment_local;
  int fragNdxOffset_local;
  FragmentProcessor *this_local;
  
  for (frag._4_4_ = 0; frag._4_4_ < 0x40; frag._4_4_ = frag._4_4_ + 1) {
    if ((this->m_sampleRegister[frag._4_4_].isAlive & 1U) != 0) {
      originalValue.m_data._8_8_ =
           inputFragments + (fragNdxOffset + frag._4_4_ / numSamplesPerFragment);
      iVar1 = tcu::Vector<int,_2>::x((Vector<int,_2> *)originalValue.m_data._8_8_);
      tcu::Vector<int,_2>::y((Vector<int,_2> *)originalValue.m_data._8_8_);
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_50,(int)colorBuffer,
                 frag._4_4_ % numSamplesPerFragment,iVar1);
      tcu::select<int,4>((tcu *)&local_60,&this->m_sampleRegister[frag._4_4_].signedValue,
                         (Vector<int,_4> *)local_50,colorMask);
      iVar1 = tcu::Vector<int,_2>::x((Vector<int,_2> *)originalValue.m_data._8_8_);
      z = tcu::Vector<int,_2>::y((Vector<int,_2> *)originalValue.m_data._8_8_);
      tcu::PixelBufferAccess::setPixel
                (colorBuffer,&local_60,frag._4_4_ % numSamplesPerFragment,iVar1,z);
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeSignedValueWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const tcu::BVec4& colorMask, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			const IVec4			originalValue	= colorBuffer.getPixelInt(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

			colorBuffer.setPixel(tcu::select(m_sampleRegister[regSampleNdx].signedValue, originalValue, colorMask), fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}